

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeDensity.cpp
# Opt level: O1

void __thiscall
OpenMD::PipeDensity::PipeDensity
          (PipeDensity *this,SimInfo *info,string *filename,string *sele,int nbins,int nbins2,
          int axis)

{
  SelectionEvaluator *this_00;
  string *psVar1;
  int iVar2;
  pointer pcVar3;
  long *plVar4;
  char *pcVar5;
  pointer pOVar6;
  long lVar7;
  ulong uVar8;
  undefined1 local_80 [24];
  long lStack_68;
  SelectionManager *local_60;
  string *local_58;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins2);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__PipeDensity_0033aff0;
  local_58 = &this->selectionScript_;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar3 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + sele->_M_string_length);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_60 = &this->seleMan_;
  SelectionManager::SelectionManager(local_60,info);
  this->nBins2_ = nbins;
  this->axis_ = axis;
  psVar1 = &this->axisLabel1_;
  (this->axisLabel1_)._M_dataplus._M_p = (pointer)&(this->axisLabel1_).field_2;
  (this->axisLabel1_)._M_string_length = 0;
  (this->axisLabel1_).field_2._M_local_buf[0] = '\0';
  (this->axisLabel2_)._M_dataplus._M_p = (pointer)&(this->axisLabel2_).field_2;
  (this->axisLabel2_)._M_string_length = 0;
  (this->axisLabel2_).field_2._M_local_buf[0] = '\0';
  (this->sliceSDLists_).
  super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sliceSDLists_).
  super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sliceSDLists_).
  super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->density_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->density_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->density_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_80,this_00);
    lVar7 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar7),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_80._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar7));
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_80);
  }
  std::
  vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
  ::resize(&this->sliceSDLists_,(ulong)this->nBins2_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->density_,(ulong)this->nBins2_);
  if (this->nBins2_ != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::resize((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                *)((long)&(((this->sliceSDLists_).
                            super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                          )._M_impl.super__Vector_impl_data + lVar7),
               (ulong)(this->super_StaticAnalyser).nBins_);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->density_).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar7),(ulong)(this->super_StaticAnalyser).nBins_
                );
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar8 < this->nBins2_);
  }
  iVar2 = this->axis_;
  this->axis1_ = ((iVar2 + 1) / 3) * -3 + iVar2 + 1;
  this->axis2_ = ((iVar2 + 2) / 3) * -3 + iVar2 + 2;
  pcVar5 = (char *)(this->axisLabel1_)._M_string_length;
  if (iVar2 == 0) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,0x2d6956);
    pcVar5 = "z";
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,0x2c8dd7);
    pcVar5 = "x";
  }
  else {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,0x2cea0f);
    pcVar5 = "y";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->axisLabel2_,0,(char *)(this->axisLabel2_)._M_string_length,(ulong)pcVar5)
  ;
  getPrefix(&local_50,filename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar6 = (pointer)(plVar4 + 2);
  if ((pointer)*plVar4 == pOVar6) {
    local_80._16_8_ =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_68 = plVar4[3];
    local_80._0_8_ = (pointer)(local_80 + 0x10);
  }
  else {
    local_80._16_8_ =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_80._0_8_ = (pointer)*plVar4;
  }
  local_80._8_8_ = plVar4[1];
  *plVar4 = (long)pOVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_80._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PipeDensity::PipeDensity(SimInfo* info, const std::string& filename,
                           const std::string& sele, int nbins, int nbins2,
                           int axis) :
      StaticAnalyser(info, filename, nbins2),
      selectionScript_(sele), evaluator_(info), seleMan_(info), nBins2_(nbins),
      axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // fixed number of bins

    sliceSDLists_.resize(nBins2_);
    density_.resize(nBins2_);
    for (unsigned int i = 0; i < nBins2_; ++i) {
      sliceSDLists_[i].resize(nBins_);
      density_[i].resize(nBins_);
    }

    // Compute complementary axes to the privileged axis
    axis1_ = (axis_ + 1) % 3;
    axis2_ = (axis_ + 2) % 3;

    // Set the axis labels for the non-privileged axes
    switch (axis_) {
    case 0:
      axisLabel1_ = "y";
      axisLabel2_ = "z";
      break;
    case 1:
      axisLabel1_ = "z";
      axisLabel2_ = "x";
      break;
    case 2:
    default:
      axisLabel1_ = "x";
      axisLabel2_ = "y";
      break;
    }

    setOutputName(getPrefix(filename) + ".PipeDensity");
  }